

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O0

void __thiscall fc_layer_t::activate(fc_layer_t *this)

{
  point_t d;
  float *pfVar1;
  reference pvVar2;
  fc_layer_t *in_RDI;
  int m;
  int z;
  int j;
  int i;
  float inputv;
  int n;
  int in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  int local_1c;
  int local_18;
  int local_14;
  float local_10;
  int local_c;
  
  for (local_c = 0; local_c < (in_RDI->super_layer_t).out.size.x; local_c = local_c + 1) {
    local_10 = 0.0;
    for (local_14 = 0; local_14 < (in_RDI->super_layer_t).in.size.x; local_14 = local_14 + 1) {
      for (local_18 = 0; local_18 < (in_RDI->super_layer_t).in.size.y; local_18 = local_18 + 1) {
        for (local_1c = 0; local_1c < (in_RDI->super_layer_t).in.size.z; local_1c = local_1c + 1) {
          d.y = local_18;
          d.x = local_14;
          d.z = local_1c;
          map(in_RDI,d);
          pfVar1 = tensor_t<float>::operator()
                             ((tensor_t<float> *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (int)in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
          in_stack_ffffffffffffffb4 = *pfVar1;
          pfVar1 = tensor_t<float>::operator()
                             ((tensor_t<float> *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (int)in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
          local_10 = in_stack_ffffffffffffffb4 * *pfVar1 + local_10;
        }
      }
    }
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&in_RDI->input,(long)local_c);
    *pvVar2 = local_10;
    in_stack_ffffffffffffffb0 =
         activator_function((fc_layer_t *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),local_10);
    pfVar1 = tensor_t<float>::operator()
                       ((tensor_t<float> *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(int)local_10,
                        in_stack_ffffffffffffffa8,0);
    *pfVar1 = in_stack_ffffffffffffffb0;
    in_stack_ffffffffffffffac = local_10;
  }
  return;
}

Assistant:

void activate() {
    for (int n = 0; n < out.size.x; n++) {
      float inputv = 0;

      for (int i = 0; i < in.size.x; i++)
        for (int j = 0; j < in.size.y; j++)
          for (int z = 0; z < in.size.z; z++) {
            int m = map({i, j, z});
            inputv += in(i, j, z) * weights(m, n, 0);
          }

      input[n] = inputv;

      // activate function
      out(n, 0, 0) = activator_function(inputv);
    }
  }